

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O3

void __thiscall boost::detail::shared_state_base::notify_deferred(shared_state_base *this)

{
  unique_lock<boost::mutex> lock;
  unique_lock<boost::mutex> local_20;
  
  local_20.m = (mutex *)(this + 0x30);
  local_20.is_locked = false;
  unique_lock<boost::mutex>::lock(&local_20);
  mark_finished_internal(this,&local_20);
  if (local_20.is_locked == true) {
    mutex::unlock(local_20.m);
  }
  return;
}

Assistant:

void notify_deferred()
            {
              boost::unique_lock<boost::mutex> lock(this->mutex);
              mark_finished_internal(lock);
            }